

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# playermenu.cpp
# Opt level: O2

void __thiscall DPlayerMenu::UpdateColorsets(DPlayerMenu *this)

{
  int *piVar1;
  int iVar2;
  FListMenuItem *pFVar3;
  FPlayerColorSet *pFVar4;
  ulong uVar5;
  ulong uVar6;
  FName local_2c;
  
  local_2c.Index = 0x1e6;
  pFVar3 = DListMenu::GetItem(&this->super_DListMenu,&local_2c);
  if (pFVar3 != (FListMenuItem *)0x0) {
    PClassPlayerPawn::EnumColorSets(this->PlayerClass->Type,&this->PlayerColorSets);
    uVar6 = 0;
    (*pFVar3->_vptr_FListMenuItem[8])(pFVar3,0,"Custom");
    while (uVar6 < (this->PlayerColorSets).Count) {
      pFVar4 = TMap<int,_FPlayerColorSet,_THashTraits<int>,_TValueTraits<FPlayerColorSet>_>::
               CheckKey(&this->PlayerClass->Type->ColorSets,(this->PlayerColorSets).Array[uVar6]);
      uVar6 = uVar6 + 1;
      (*pFVar3->_vptr_FListMenuItem[8])
                (pFVar3,uVar6 & 0xffffffff,FName::NameData.NameArray[(pFVar4->Name).Index].Text);
    }
    iVar2 = userinfo_t::GetColorSet((userinfo_t *)(&DAT_009ba458 + (long)consoleplayer * 0x2a0));
    if (iVar2 == -1) {
      uVar6 = 0;
    }
    else {
      uVar5 = 0;
      uVar6 = 0;
      while ((this->PlayerColorSets).Count != uVar5) {
        piVar1 = (this->PlayerColorSets).Array + uVar5;
        uVar5 = uVar5 + 1;
        if (*piVar1 == iVar2) {
          uVar6 = uVar5 & 0xffffffff;
        }
      }
    }
    (*pFVar3->_vptr_FListMenuItem[10])(pFVar3,0,uVar6);
  }
  return;
}

Assistant:

void DPlayerMenu::UpdateColorsets()
{
	FListMenuItem *li = GetItem(NAME_Color);
	if (li != NULL)
	{
		int sel = 0;
		PlayerClass->Type->EnumColorSets(&PlayerColorSets);
		li->SetString(0, "Custom");
		for(unsigned i=0;i<PlayerColorSets.Size(); i++)
		{
			FPlayerColorSet *colorset = PlayerClass->Type->GetColorSet(PlayerColorSets[i]);
			li->SetString(i+1, colorset->Name);
		}
		int mycolorset = players[consoleplayer].userinfo.GetColorSet();
		if (mycolorset != -1)
		{
			for(unsigned i=0;i<PlayerColorSets.Size(); i++)
			{
				if (PlayerColorSets[i] == mycolorset)
				{
					sel = i+1;
				}
			}
		}
		li->SetValue(0, sel);
	}
}